

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_0xx3_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  switch(quads[1]) {
  case 0:
    sh4asm_txt_bsrf_rn(em,quads[2]);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
    break;
  case 2:
    sh4asm_txt_braf_rn(em,quads[2]);
    break;
  case 8:
    sh4asm_txt_pref_arn(em,quads[2]);
    break;
  case 9:
    sh4asm_txt_ocbi_arn(em,quads[2]);
    break;
  case 10:
    sh4asm_txt_ocbp_arn(em,quads[2]);
    break;
  case 0xb:
    sh4asm_txt_ocbwb_arn(em,quads[2]);
    break;
  case 0xc:
    sh4asm_txt_movcal_r0_arn(em,quads[2]);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_0xx3_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    // mask is 0xf0ff
    switch (quads[1]) {
    case 0:
        sh4asm_txt_bsrf_rn(em, quads[2]);
        break;
    case 2:
        sh4asm_txt_braf_rn(em, quads[2]);
        break;
    case 8:
        sh4asm_txt_pref_arn(em, quads[2]);
        break;
    case 9:
        sh4asm_txt_ocbi_arn(em, quads[2]);
        break;
    case 10:
        sh4asm_txt_ocbp_arn(em, quads[2]);
        break;
    case 11:
        sh4asm_txt_ocbwb_arn(em, quads[2]);
        break;
    case 12:
        sh4asm_txt_movcal_r0_arn(em, quads[2]);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}